

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_analysis.cc
# Opt level: O0

void absl::lts_20250127::cord_internal::anon_unknown_0::
     AnalyzeBtree<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)1>
               (CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)1> rep,
               RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)1>
               *raw_usage)

{
  int iVar1;
  iterator ppCVar2;
  CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)1> rep_00;
  CordRep *edge_1;
  iterator __end4_1;
  iterator __begin4_1;
  Span<absl::lts_20250127::cord_internal::CordRep_*const> *local_68;
  Span<absl::lts_20250127::cord_internal::CordRep_*const> *__range4_1;
  Nonnull<const_CordRep_*> local_58;
  CordRep *edge;
  iterator __end4;
  iterator __begin4;
  Span<absl::lts_20250127::cord_internal::CordRep_*const> *local_30;
  Span<absl::lts_20250127::cord_internal::CordRep_*const> *__range4;
  CordRepBtree *tree;
  RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)1> *local_18;
  RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)1> *raw_usage_local;
  CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)1> rep_local;
  
  tree = (CordRepBtree *)rep.rep;
  local_18 = raw_usage;
  raw_usage_local =
       (RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)1> *)rep.rep;
  RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)1>::Add
            (raw_usage,0x40,rep);
  __range4 = (Span<absl::lts_20250127::cord_internal::CordRep_*const> *)
             CordRep::btree((CordRep *)raw_usage_local);
  iVar1 = CordRepBtree::height((CordRepBtree *)__range4);
  if (iVar1 < 1) {
    ___begin4_1 = CordRepBtree::Edges((CordRepBtree *)__range4);
    local_68 = (Span<absl::lts_20250127::cord_internal::CordRep_*const> *)&__begin4_1;
    __end4_1 = Span<absl::lts_20250127::cord_internal::CordRep_*const>::begin(local_68);
    ppCVar2 = Span<absl::lts_20250127::cord_internal::CordRep_*const>::end(local_68);
    for (; __end4_1 != ppCVar2; __end4_1 = __end4_1 + 1) {
      rep_00 = CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)1>::Child
                         ((CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)1>
                           *)&raw_usage_local,*__end4_1);
      AnalyzeDataEdge<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)1>
                (rep_00,local_18);
    }
  }
  else {
    ___begin4 = CordRepBtree::Edges((CordRepBtree *)__range4);
    local_30 = (Span<absl::lts_20250127::cord_internal::CordRep_*const> *)&__begin4;
    __end4 = Span<absl::lts_20250127::cord_internal::CordRep_*const>::begin(local_30);
    edge = (CordRep *)Span<absl::lts_20250127::cord_internal::CordRep_*const>::end(local_30);
    for (; (CordRep *)__end4 != edge; __end4 = __end4 + 1) {
      local_58 = *__end4;
      __range4_1 = (Span<absl::lts_20250127::cord_internal::CordRep_*const> *)
                   CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)1>::
                   Child((CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)1>
                          *)&raw_usage_local,local_58);
      AnalyzeBtree<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)1>
                ((CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)1>)
                 __range4_1,local_18);
    }
  }
  return;
}

Assistant:

void AnalyzeBtree(CordRepRef<mode> rep, RawUsage<mode>& raw_usage) {
  raw_usage.Add(sizeof(CordRepBtree), rep);
  const CordRepBtree* tree = rep.rep->btree();
  if (tree->height() > 0) {
    for (CordRep* edge : tree->Edges()) {
      AnalyzeBtree(rep.Child(edge), raw_usage);
    }
  } else {
    for (CordRep* edge : tree->Edges()) {
      AnalyzeDataEdge(rep.Child(edge), raw_usage);
    }
  }
}